

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O2

void __thiscall CommandBlock::Launch(CommandBlock *this)

{
  int iVar1;
  Process *this_00;
  allocator local_99;
  Config local_98;
  string_type local_88;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  iVar1 = (*(this->super_Block)._vptr_Block[4])();
  if ((char)iVar1 != '\0') {
    (*(this->super_Block)._vptr_Block[3])(this);
  }
  (this->consoleOutput)._M_string_length = 0;
  *(this->consoleOutput)._M_dataplus._M_p = '\0';
  this_00 = (Process *)operator_new(0xd8);
  std::__cxx11::string::string((string *)&local_88,"",&local_99);
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/pipeline.hpp:44:20)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/pipeline.hpp:44:20)>
             ::_M_manager;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_98.inherit_file_descriptors = false;
  local_98._9_7_ = 0;
  local_98.buffer_size = 0x20000;
  local_48._M_unused._M_object = this;
  TinyProcessLib::Process::Process
            (this_00,&this->command,&local_88,
             (function<void_(const_char_*,_unsigned_long)> *)&local_48,
             (function<void_(const_char_*,_unsigned_long)> *)&local_68,false,&local_98);
  this->process = this_00;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  puts((this->command)._M_dataplus._M_p);
  return;
}

Assistant:

virtual void Launch() override
    {
        if (IsRunning())
        {
            Stop();
        }
        consoleOutput.clear();
        auto clb = [this](const char *bytes, size_t n) {
            consoleOutput += std::string(bytes, n);
        };
        process = new Process(command, "", clb);
        printf("%s\n", command.c_str());
    }